

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  uint64_t *key;
  long lVar1;
  long lVar2;
  undefined4 in_EAX;
  ulong uVar3;
  ulong uVar4;
  size_t len;
  uchar *data;
  secp256k1_fe *data_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long unaff_R13;
  long lVar8;
  bool bVar9;
  secp256k1_hmac_sha256 sStack_148;
  secp256k1_fe *psStack_78;
  undefined8 uStack_70;
  long lStack_68;
  secp256k1_fe *psStack_60;
  secp256k1_fe *psStack_58;
  long lStack_50;
  long lStack_48;
  code *pcStack_40;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44(alen,in_EAX);
  lVar8 = 0;
  lVar6 = 0;
  uVar5 = 0;
  do {
    if (lVar8 < alen) {
      uVar3 = factor * a->v[lVar8];
      uVar4 = SUB168(SEXT816(factor) * SEXT816(a->v[lVar8]),8);
      lVar1 = (uVar4 ^ 0x7fffffffffffffff) - lVar6;
      lVar7 = (-0x8000000000000000 - uVar4) - (ulong)(uVar3 != 0);
      lVar2 = lVar6 - lVar7;
      unaff_R13 = lVar2 - (ulong)(uVar5 < -uVar3);
      bVar9 = (SBORROW8(uVar4 ^ 0x7fffffffffffffff,lVar6) != SBORROW8(lVar1,(ulong)(~uVar3 < uVar5))
              ) == (long)(lVar1 - (ulong)(~uVar3 < uVar5)) < 0;
      if ((long)uVar4 < 0) {
        bVar9 = (SBORROW8(lVar6,lVar7) != SBORROW8(lVar2,(ulong)(uVar5 < -uVar3))) == unaff_R13 < 0;
      }
      if (!bVar9) {
        pcStack_40 = (code *)0x14c488;
        secp256k1_modinv64_mul_62_cold_1();
        goto LAB_0014c488;
      }
      bVar9 = CARRY8(uVar5,uVar3);
      uVar5 = uVar5 + uVar3;
      lVar6 = lVar6 + uVar4 + (ulong)bVar9;
    }
    uVar3 = lVar6 << 2 | uVar5 >> 0x3e;
    r->v[lVar8] = uVar5 & 0x3fffffffffffffff;
    lVar6 = lVar6 >> 0x3e;
    lVar8 = lVar8 + 1;
    uVar5 = uVar3;
    if (lVar8 == 4) {
      if (4 < alen) {
        uVar5 = factor * a->v[4];
        bVar9 = CARRY8(uVar3,uVar5);
        uVar3 = uVar3 + uVar5;
        lVar6 = lVar6 + SUB168(SEXT816(factor) * SEXT816(a->v[4]),8) + (ulong)bVar9;
      }
      if (lVar6 + -1 + (ulong)(0x7fffffffffffffff < uVar3) == -1) {
        if (lVar6 == (long)uVar3 >> 0x3f) {
          r->v[4] = uVar3;
          return;
        }
      }
      else {
LAB_0014c488:
        pcStack_40 = (code *)0x14c48d;
        secp256k1_modinv64_mul_62_cold_3();
      }
      pcStack_40 = secp256k1_gej_verify;
      secp256k1_modinv64_mul_62_cold_2();
      pcStack_40 = (code *)0x7fffffffffffffff;
      psStack_58 = (secp256k1_fe *)0x14c49f;
      lStack_50 = (long)alen;
      lStack_48 = lVar8;
      secp256k1_fe_verify((secp256k1_fe *)r);
      a_00 = (secp256k1_fe *)((long)r + 0x30);
      psStack_58 = (secp256k1_fe *)0x14c4ab;
      secp256k1_fe_verify(a_00);
      a_01 = (secp256k1_fe *)((long)r + 0x60);
      psStack_58 = (secp256k1_fe *)0x14c4b7;
      secp256k1_fe_verify(a_01);
      psStack_58 = (secp256k1_fe *)0x14c4c4;
      secp256k1_fe_verify_magnitude((secp256k1_fe *)r,4);
      psStack_58 = (secp256k1_fe *)0x14c4d1;
      secp256k1_fe_verify_magnitude(a_00,4);
      data = (uchar *)0x1;
      psStack_58 = (secp256k1_fe *)0x14c4de;
      data_00 = a_01;
      secp256k1_fe_verify_magnitude(a_01,1);
      if ((uint)((secp256k1_fe *)((long)r + 0x90))->n[0] < 2) {
        return;
      }
      psStack_58 = (secp256k1_fe *)secp256k1_rfc6979_hmac_sha256_initialize;
      secp256k1_gej_verify_cold_1();
      uStack_70 = 0x3fffffffffffffff;
      data_00->n[2] = 0x101010101010101;
      data_00->n[3] = 0x101010101010101;
      data_00->n[0] = 0x101010101010101;
      data_00->n[1] = 0x101010101010101;
      key = data_00->n + 4;
      data_00->n[4] = 0;
      data_00->magnitude = 0;
      data_00->normalized = 0;
      data_00[1].n[0] = 0;
      data_00[1].n[1] = 0;
      psStack_78 = (secp256k1_fe *)r;
      lStack_68 = unaff_R13;
      psStack_60 = a_00;
      psStack_58 = a_01;
      secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
      secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
      secp256k1_sha256_write(&sStack_148.inner,"",1);
      secp256k1_sha256_write(&sStack_148.inner,data,len);
      secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)key);
      secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
      secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
      secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)data_00);
      secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
      secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
      secp256k1_sha256_write(&sStack_148.inner,"\x01",1);
      secp256k1_sha256_write(&sStack_148.inner,data,len);
      secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)key);
      secp256k1_hmac_sha256_initialize(&sStack_148,(uchar *)key,0x20);
      secp256k1_sha256_write(&sStack_148.inner,(uchar *)data_00,0x20);
      secp256k1_hmac_sha256_finalize(&sStack_148,(uchar *)data_00);
      *(undefined4 *)(data_00[1].n + 2) = 0;
      return;
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}